

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

MSize lj_tab_len_hint(GCtab *t,size_t hint)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  cTValue *pcVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar2 = (t->array).ptr64;
  if (hint + 1 < (ulong)t->asize) {
    if ((*(long *)(uVar2 + hint * 8) == -1) || (*(long *)(uVar2 + 8 + hint * 8) != -1)) {
lj_tab_len:
      uVar6 = (ulong)t->asize - 1;
      if ((ulong)t->asize == 0) {
        uVar6 = 0;
      }
      if ((uVar6 != 0) && (uVar2 = (t->array).ptr64, *(long *)(uVar2 + uVar6 * 8) == -1)) {
        uVar3 = 0;
        if (uVar6 != 1) {
          uVar3 = 0;
          do {
            uVar5 = uVar3 + uVar6 >> 1;
            if (*(long *)(uVar2 + uVar5 * 8) != -1) {
              uVar3 = uVar5;
              uVar5 = uVar6;
            }
            uVar6 = uVar5;
          } while (1 < uVar5 - uVar3);
        }
        return (MSize)uVar3;
      }
      if (t->hmask == 0) {
        return (MSize)uVar6;
      }
      uVar1 = t->asize;
      uVar3 = uVar6 + 1;
      while( true ) {
        uVar7 = (uint)uVar3;
        if (uVar7 < uVar1) {
          pcVar4 = (cTValue *)((long)(int)uVar7 * 8 + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar7);
        }
        if ((pcVar4 == (cTValue *)0x0) || (pcVar4->u64 == 0xffffffffffffffff)) break;
        bVar10 = 0x3ffffffe < uVar3;
        uVar6 = uVar3;
        uVar3 = uVar3 * 2;
        if (bVar10) {
          lVar8 = 0x100000000;
          uVar3 = 0;
          do {
            uVar6 = uVar3;
            uVar7 = (int)uVar6 + 1;
            if (uVar7 < uVar1) {
              pcVar4 = (cTValue *)((lVar8 >> 0x1d) + (t->array).ptr64);
            }
            else {
              pcVar4 = lj_tab_getinth(t,uVar7);
            }
          } while ((pcVar4 != (cTValue *)0x0) &&
                  (lVar8 = lVar8 + 0x100000000, uVar3 = (ulong)uVar7,
                  pcVar4->u64 != 0xffffffffffffffff));
LAB_001299b7:
          return (MSize)uVar6;
        }
      }
      uVar5 = uVar3 - uVar6;
      while (1 < uVar5) {
        uVar9 = uVar3 + uVar6 >> 1;
        uVar7 = (uint)uVar9;
        if (uVar7 < uVar1) {
          pcVar4 = (cTValue *)((long)(int)uVar7 * 8 + (t->array).ptr64);
        }
        else {
          pcVar4 = lj_tab_getinth(t,uVar7);
        }
        if ((pcVar4 != (cTValue *)0x0) && (pcVar4->u64 != 0xffffffffffffffff)) {
          uVar6 = uVar9;
          uVar9 = uVar3;
        }
        uVar3 = uVar9;
        uVar5 = uVar9 - uVar6;
      }
      goto LAB_001299b7;
    }
  }
  else if ((((ulong)t->asize < hint + 1) || (t->hmask != 0)) || (*(long *)(uVar2 + hint * 8) == -1))
  goto lj_tab_len;
  return (MSize)hint;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len_hint(GCtab *t, size_t hint)
{
  size_t asize = (size_t)t->asize;
  cTValue *tv = arrayslot(t, hint);
  if (LJ_LIKELY(hint+1 < asize)) {
    if (LJ_LIKELY(!tvisnil(tv) && tvisnil(tv+1))) return (MSize)hint;
  } else if (hint+1 <= asize && LJ_LIKELY(t->hmask == 0) && !tvisnil(tv)) {
    return (MSize)hint;
  }
  return lj_tab_len(t);
}